

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndicesRef
          (PlanningUnitMADPDiscrete *this,Index jObsHistI)

{
  const_reference ppJVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  ostream *poVar3;
  E *this_00;
  stringstream ss;
  ostream local_188 [376];
  
  if ((ulong)jObsHistI < this->_m_nrJointObservationHistories) {
    ppJVar1 = std::
              vector<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
              ::at(&this->_m_jointObservationHistoryTreeVector,(ulong)jObsHistI);
    pvVar2 = JointObservationHistory::GetIndividualObservationHistoryIndices
                       (((*ppJVar1)->super_TreeNode<JointObservationHistory>)._m_containedElem);
    return pvVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_188,"PlanningUnitMADPDiscrete::JointToIndividualObservationHistory"
                          );
  poVar3 = std::operator<<(poVar3,"Indices ERROR: index (");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,") out of bounds!");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

const vector<Index>&
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndicesRef(Index
        jObsHistI) const
{
    if(jObsHistI < _m_nrJointObservationHistories)
    {
        JointObservationHistoryTree* joht = 
            _m_jointObservationHistoryTreeVector.at(jObsHistI);
        return(joht->GetJointObservationHistory()->
                GetIndividualObservationHistoryIndices());
    }
    else
    {
        stringstream ss;
        ss << "PlanningUnitMADPDiscrete::JointToIndividualObservationHistory"<<
           "Indices ERROR: index ("<< jObsHistI <<") out of bounds!"<<endl;
        throw E(ss); 
    }
}